

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O1

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CArgument *stm)

{
  initializer_list<INode_*> __l;
  vector<INode_*,_std::allocator<INode_*>_> children;
  allocator_type local_a1;
  vector<INode_*,_std::allocator<INode_*>_> local_a0;
  string local_88;
  vector<INode_*,_std::allocator<INode_*>_> local_68;
  ChildrenAnswers local_50;
  _Head_base<0UL,_CType_*,_false> local_20;
  CIdExp *local_18;
  
  local_20._M_head_impl =
       (stm->type)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
       super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
       super__Head_base<0UL,_CType_*,_false>._M_head_impl;
  local_18 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
             super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
             super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_20;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&local_68,__l,&local_a1);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&local_a0,&local_68);
  VisitChildren(&local_50,this,&local_a0);
  AddChildrenAnswers(this,&local_50);
  if (local_50.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50.descriptions);
  if (local_a0.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Argument","");
  AddLabel(this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  this->lastVisited = this->lastVisited + 1;
  if (local_68.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CPrintVisitor::Visit(CArgument &stm) {
	std::vector<INode*> children = { stm.type.get(), stm.id.get() };
	AddChildrenAnswers(VisitChildren(children));
	AddLabel("Argument");
	++lastVisited;
}